

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgException.h
# Opt level: O0

void __thiscall
TCLAP::SpecificationException::SpecificationException
          (SpecificationException *this,string *text,string *id)

{
  string *in_RDX;
  string *in_RSI;
  undefined8 *in_RDI;
  string *text_00;
  ArgException *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  allocator<char> local_b1;
  string local_b0 [55];
  undefined1 local_79 [33];
  string local_58 [32];
  string local_38 [56];
  
  text_00 = (string *)local_79;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28,
             (allocator<char> *)in_stack_ffffffffffffff20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28,
             (allocator<char> *)in_stack_ffffffffffffff20);
  std::operator+(in_stack_ffffffffffffff28,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28,
             (allocator<char> *)in_stack_ffffffffffffff20);
  std::operator+(in_stack_ffffffffffffff28,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff20);
  ArgException::ArgException(in_stack_ffffffffffffff20,text_00,in_RDX,in_RSI);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff27);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::__cxx11::string::~string((string *)(local_79 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_79);
  *in_RDI = &PTR__SpecificationException_00158be8;
  return;
}

Assistant:

SpecificationException( const std::string& text = "undefined exception",
					            const std::string& id = "undefined" )
			: ArgException( text, 
			                id,
							std::string("Exception found when an Arg object ")+
							std::string("is improperly defined by the ") +
							std::string("developer." )) 
		{ }